

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  initializer_list<double> percentages;
  allocator<char> local_2c1;
  vector<DataSet,_std::allocator<DataSet>_> datasets;
  Optimization local_29c;
  DataSet dataset;
  CDT model;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&datasets,"../examples/",&local_2c1);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&model,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&datasets,
                 "IRIS.csv");
  local_29c.fit_func = 0x1010001;
  DataSet::DataSet(&dataset,(string *)&model,(ReadInfo *)&local_29c);
  std::__cxx11::string::~string((string *)&model);
  std::__cxx11::string::~string((string *)&datasets);
  DataSet::shuffle(&dataset);
  model.m_dataset.m_filepath._M_dataplus._M_p = (pointer)0x4049000000000000;
  model.m_dataset.m_filepath._M_string_length = 0x4049000000000000;
  percentages._M_len = 2;
  percentages._M_array = (iterator)&model;
  DataSet::split(&datasets,&dataset,percentages);
  DataSet::dc_sort(datasets.super__Vector_base<DataSet,_std::allocator<DataSet>_>._M_impl.
                   super__Vector_impl_data._M_start);
  CDT::CDT(&model,datasets.super__Vector_base<DataSet,_std::allocator<DataSet>_>._M_impl.
                  super__Vector_impl_data._M_start,4,true);
  local_29c.fit_func = NO_FIT;
  local_29c.split_dist = HALF;
  local_29c.confidence = 0x14;
  CDT::optimize(&model,&local_29c);
  CDT::compile(&model,3);
  CDT::fit(&model);
  CDT::test(&model,(ostream *)&std::cout,
            datasets.super__Vector_base<DataSet,_std::allocator<DataSet>_>._M_impl.
            super__Vector_impl_data._M_start);
  CDT::test(&model,(ostream *)&std::cout,
            datasets.super__Vector_base<DataSet,_std::allocator<DataSet>_>._M_impl.
            super__Vector_impl_data._M_start + 1);
  CDT::~CDT(&model);
  std::vector<DataSet,_std::allocator<DataSet>_>::~vector(&datasets);
  DataSet::~DataSet(&dataset);
  return 0;
}

Assistant:

int main(){

    // ReadInfo info{true, true, true, true};

    // DataSet dataset("new.csv", READ(00011));
    // cout<<dataset.labels_string()<<'\n';
    // cout<<dataset<<'\n';

    // vector<DataSet> datasets=dataset.split({20,30,50});
    // for(auto& ds: datasets){
    //     ds.shuffle();
    //     cout<<'\n'<<ds;
    // }

    // datasets[1].save("new.csv", WRITE(000));

    DataSet dataset(EXAMPLE("IRIS.csv"), READ(01011));
    dataset.shuffle();

    std::vector<DataSet> datasets=dataset.split({50,50});
    datasets[0].dc_sort();
    // cout<<datasets[0]<<'\n';

    CDT model(datasets[0], 4, true);
    model.optimize(Optimization{NO_FIT, HALF, 20});
    model.compile();
    // model.train();
    model.fit();

    model.test(cout, datasets[0]);
    // int ans;
    // cout<<"Show activation? ";
    // cin>>ans;
    // if(ans){
    //     std::cout<<"#Params: "<<model.m_function.m_params.size()<<'\n';
    //     for(unsigned i=0;i<model.m_function.m_params.size();++i){
    //         cout<<"Mid: "<<model.m_function.m_params[i].middle<<", ";
    //         cout<<"Len: "<<model.m_function.m_params[i].length<<", ";
    //         cout<<"Amp: "<<model.m_function.m_params[i].amplitude<<", ";
    //         cout<<"Con: "<<model.m_function.m_params[i].confidence<<"\n\n";
    //     }
    // }

    // cout<<"\n > Testing stage:\n";
    // double x;
    // unsigned dim=dataset.shape().n_col-1;
    // vector<double> inps(dim);
    // unsigned i=0;
    // while(cin>>x){
    //     inps[i++]=x;
    //     if(i==dim){
    //         i=0;
    //         cout<<model.predict(inps)<<'\n';
    //     }
    // }
    model.test(cout, datasets[1]);
    // cout<<model;

    return 0;
}